

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

int Extra_ThreshInitializeChow(int nVars,int *pChow)

{
  int local_6c;
  int iStack_68;
  int nChows;
  int Aux [16];
  int local_1c;
  int i;
  int *pChow_local;
  int nVars_local;
  
  local_6c = 0;
  for (local_1c = 0; local_1c < nVars; local_1c = local_1c + 1) {
    if ((local_1c == 0) || (pChow[local_1c] == pChow[local_1c + -1])) {
      (&iStack_68)[local_1c] = local_6c;
    }
    else {
      local_6c = local_6c + 1;
      (&iStack_68)[local_1c] = local_6c;
    }
  }
  for (local_1c = 0; local_1c < nVars; local_1c = local_1c + 1) {
    pChow[local_1c] = (&iStack_68)[local_1c];
  }
  return local_6c + 1;
}

Assistant:

int Extra_ThreshInitializeChow(int nVars, int * pChow) {
    int i = 0, Aux[16], nChows = 0;
    //group the variables which have the same Chow
    for (i = 0; i < nVars; i++) {
        if (i == 0 || (pChow[i] == pChow[i - 1]))
            Aux[i] = nChows;
        else {
            nChows++;
            Aux[i] = nChows;
        }
    }
    for (i = 0; i < nVars; i++)
        pChow[i] = Aux[i];
    nChows++;
    return nChows;

}